

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_sinusoidal_modeling_to_autocorrelation.cc
# Opt level: O2

bool __thiscall
sptk::CompositeSinusoidalModelingToAutocorrelation::Run
          (CompositeSinusoidalModelingToAutocorrelation *this,
          vector<double,_std::allocator<double>_> *input_and_output)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> input;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  if (input_and_output == (vector<double,_std::allocator<double>_> *)0x0) {
    bVar1 = false;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_30,input_and_output);
    bVar1 = Run(this,(vector<double,_std::allocator<double>_> *)&local_30,input_and_output);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  }
  return bVar1;
}

Assistant:

bool CompositeSinusoidalModelingToAutocorrelation::Run(
    std::vector<double>* input_and_output) const {
  if (NULL == input_and_output) return false;
  std::vector<double> input(*input_and_output);
  return Run(input, input_and_output);
}